

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::CLUFactor<double>::vSolveUpdateRightNoNZ(CLUFactor<double> *this,double *vec,double param_2)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  
  iVar2 = (this->l).firstUnused;
  iVar3 = (this->l).firstUpdate;
  lVar9 = (long)iVar3;
  if (iVar3 < iVar2) {
    pdVar5 = (this->l).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->l).idx;
    piVar7 = (this->l).row;
    piVar8 = (this->l).start;
    do {
      dVar1 = vec[piVar7[lVar9]];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        iVar3 = piVar8[lVar9];
        iVar11 = piVar8[lVar9 + 1];
        if (iVar3 < iVar11) {
          lVar10 = (long)iVar3 * 4;
          do {
            iVar4 = *(int *)((long)piVar6 + lVar10);
            vec[iVar4] = vec[iVar4] - *(double *)((long)pdVar5 + lVar10 * 2) * dVar1;
            iVar11 = iVar11 + -1;
            lVar10 = lVar10 + 4;
          } while (iVar3 < iVar11);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar2);
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveUpdateRightNoNZ(R* vec, R /*eps*/)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);

      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            vec[*idx++] -= x * (*val++);
         }
      }
   }
}